

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuron.hxx
# Opt level: O2

void __thiscall
SpikingNeuron::SpikingNeuron(SpikingNeuron *this,Time *time,string *name,string *type)

{
  string local_60 [32];
  string local_40 [32];
  
  std::__cxx11::string::string(local_60,(string *)name);
  std::__cxx11::string::string(local_40,(string *)type);
  (this->super_Neuron)._vptr_Neuron = (_func_int **)&PTR___cxa_pure_virtual_001554a0;
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::~string(local_60);
  StochasticEventGenerator::StochasticEventGenerator
            (&this->super_StochasticEventGenerator,time,name,type);
  (this->super_Neuron)._vptr_Neuron = (_func_int **)&PTR___cxa_pure_virtual_00155328;
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_Parametric._vptr_Parametric = (_func_int **)&PTR__SpikingNeuron_00155358;
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_TimeDependent._vptr_TimeDependent = (_func_int **)&PTR__SpikingNeuron_001553f0;
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_Physical._vptr_Physical = (_func_int **)&PTR__SpikingNeuron_00155438;
  return;
}

Assistant:

SpikingNeuron (
		Time *time,   ///< global time object
		string name,   ///< object name
		string type="Spiking Neuron"   ///< object type
	) : Neuron(name, type), StochasticEventGenerator(time, name, type) {}